

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_mouse.c
# Opt level: O0

void draw_mouse_button(int but,_Bool down)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte in_SIL;
  int in_EDI;
  undefined8 in_XMM1_Qa;
  undefined8 uVar4;
  undefined8 in_XMM2_Qa;
  undefined4 uVar7;
  double dVar5;
  double dVar6;
  undefined8 in_XMM3_Qa;
  undefined4 uVar8;
  int y;
  int x;
  ALLEGRO_COLOR black;
  ALLEGRO_COLOR grey;
  int offset [3];
  int local_18 [4];
  byte local_5;
  
  uVar8 = (undefined4)((ulong)in_XMM3_Qa >> 0x20);
  uVar7 = (undefined4)((ulong)in_XMM2_Qa >> 0x20);
  local_5 = in_SIL & 1;
  local_18[0] = 0;
  local_18[1] = 0x46;
  local_18[2] = 0x23;
  iVar1 = local_18[in_EDI + -1];
  uVar3 = al_map_rgb(0xe0,0xe0);
  uVar4 = in_XMM1_Qa;
  uVar2 = al_map_rgb(0,0);
  al_draw_filled_rectangle
            ((float)(iVar1 + 400),0x43020000,CONCAT44(uVar7,(float)(iVar1 + 0x1ab)),
             CONCAT44(uVar8,0x432c0000),uVar3,in_XMM1_Qa);
  dVar5 = (double)(iVar1 + 400);
  uVar7 = 0x40605000;
  dVar6 = dVar5 + 26.5;
  uVar8 = 0x40657000;
  al_draw_rectangle((float)(dVar5 + 0.5),0x4060500043028000,
                    CONCAT44((int)((ulong)dVar6 >> 0x20),(float)dVar6),0x40657000432b8000,uVar2,
                    uVar4,0);
  if ((local_5 & 1) != 0) {
    al_draw_filled_rectangle
              ((float)(iVar1 + 0x192),CONCAT44(uVar7,0x43040000),(float)(iVar1 + 0x1a9),
               CONCAT44(uVar8,0x432a0000),uVar2,uVar4);
  }
  return;
}

Assistant:

static void draw_mouse_button(int but, bool down)
{
   const int offset[NUM_BUTTONS] = {0, 70, 35};
   ALLEGRO_COLOR grey;
   ALLEGRO_COLOR black;
   int x;
   int y;

   x = 400 + offset[but-1];
   y = 130;

   grey = al_map_rgb(0xe0, 0xe0, 0xe0);
   black = al_map_rgb(0, 0, 0);

   al_draw_filled_rectangle(x, y, x + 27, y + 42, grey);
   al_draw_rectangle(x + 0.5, y + 0.5, x + 26.5, y + 41.5, black, 0);
   if (down) {
      al_draw_filled_rectangle(x + 2, y + 2, x + 25, y + 40, black);
   }
}